

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

array<float,_3> pbrt::SampleUniformTriangle(Point2f u)

{
  initializer_list<float> v;
  float *pfVar1;
  float fVar2;
  undefined1 in_ZMM0 [64];
  array<float,_3> aVar3;
  Float b1;
  Float b0;
  float local_3c;
  float local_38;
  float local_34;
  float *local_30;
  undefined8 local_28;
  undefined4 in_stack_ffffffffffffffe0;
  Tuple2<pbrt::Point2,_float> TVar4;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 uStack_8;
  float local_4;
  
  TVar4 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  pfVar1 = Tuple2<pbrt::Point2,_float>::operator[]
                     ((Tuple2<pbrt::Point2,_float> *)&stack0xffffffffffffffec,0);
  fVar2 = *pfVar1;
  pfVar1 = Tuple2<pbrt::Point2,_float>::operator[]
                     ((Tuple2<pbrt::Point2,_float> *)&stack0xffffffffffffffec,1);
  if (*pfVar1 <= fVar2) {
    pfVar1 = Tuple2<pbrt::Point2,_float>::operator[]
                       ((Tuple2<pbrt::Point2,_float> *)&stack0xffffffffffffffec,1);
    fVar2 = *pfVar1 / 2.0;
    pfVar1 = Tuple2<pbrt::Point2,_float>::operator[]
                       ((Tuple2<pbrt::Point2,_float> *)&stack0xffffffffffffffec,0);
    local_3c = *pfVar1 - fVar2;
    local_38 = fVar2;
  }
  else {
    pfVar1 = Tuple2<pbrt::Point2,_float>::operator[]
                       ((Tuple2<pbrt::Point2,_float> *)&stack0xffffffffffffffec,0);
    fVar2 = *pfVar1 / 2.0;
    pfVar1 = Tuple2<pbrt::Point2,_float>::operator[]
                       ((Tuple2<pbrt::Point2,_float> *)&stack0xffffffffffffffec,1);
    local_38 = *pfVar1 - fVar2;
    local_3c = fVar2;
  }
  local_34 = (1.0 - local_3c) - local_38;
  local_30 = &local_3c;
  local_28 = 3;
  v._4_8_ = TVar4;
  v._M_array._0_4_ = local_3c;
  v._M_len._4_4_ = in_stack_fffffffffffffff4;
  pstd::array<float,_3>::array((array<float,_3> *)CONCAT44(local_38,in_stack_ffffffffffffffe0),v);
  aVar3.values[0] = (float)in_stack_fffffffffffffff4;
  aVar3.values[1] = (float)uStack_8;
  aVar3.values[2] = local_4;
  return (array<float,_3>)aVar3.values;
}

Assistant:

PBRT_CPU_GPU inline pstd::array<Float, 3> SampleUniformTriangle(Point2f u) {
    Float b0, b1;
    if (u[0] < u[1]) {
        b0 = u[0] / 2;
        b1 = u[1] - b0;
    } else {
        b1 = u[1] / 2;
        b0 = u[0] - b1;
    }
    return {b0, b1, 1 - b0 - b1};
}